

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# undo_buffer.cpp
# Opt level: O3

void __thiscall
duckdb::UndoBuffer::WriteToWAL
          (UndoBuffer *this,WriteAheadLog *wal,
          optional_ptr<duckdb::StorageCommitState,_true> commit_state)

{
  UndoFlags type;
  UndoFlags UVar1;
  BufferManager *pBVar2;
  UndoFlags *pUVar3;
  BufferHandle BStack_a8;
  optional_ptr<duckdb::UndoBufferEntry,_true> local_90;
  UndoFlags *local_88;
  UndoFlags *local_80;
  WALWriteState local_78;
  BufferHandle local_48;
  
  WALWriteState::WALWriteState(&local_78,this->transaction,wal,commit_state);
  BufferHandle::BufferHandle(&BStack_a8);
  local_90.ptr = (this->allocator).tail.ptr;
  if (local_90.ptr != (UndoBufferEntry *)0x0) {
    do {
      pBVar2 = (this->allocator).buffer_manager;
      optional_ptr<duckdb::UndoBufferEntry,_true>::CheckValid(&local_90);
      (*pBVar2->_vptr_BufferManager[7])(&local_48,pBVar2,&(local_90.ptr)->block);
      BufferHandle::operator=(&BStack_a8,&local_48);
      BufferHandle::~BufferHandle(&local_48);
      optional_ptr<duckdb::FileBuffer,_true>::CheckValid(&BStack_a8.node);
      pUVar3 = (UndoFlags *)(BStack_a8.node.ptr)->buffer;
      local_88 = pUVar3;
      optional_ptr<duckdb::UndoBufferEntry,_true>::CheckValid(&local_90);
      local_80 = (UndoFlags *)((long)pUVar3 + (local_90.ptr)->position);
      if (local_88 < local_80) {
        do {
          type = *local_88;
          UVar1 = local_88[1];
          local_88 = local_88 + 2;
          WALWriteState::CommitEntry(&local_78,type,(data_ptr_t)local_88);
          local_88 = (UndoFlags *)((ulong)UVar1 + (long)local_88);
        } while (local_88 < local_80);
      }
      optional_ptr<duckdb::UndoBufferEntry,_true>::CheckValid(&local_90);
      local_90.ptr = ((local_90.ptr)->prev).ptr;
    } while (local_90.ptr != (UndoBufferEntry *)0x0);
  }
  BufferHandle::~BufferHandle(&BStack_a8);
  if ((_Head_base<0UL,_duckdb::DataChunk_*,_false>)
      local_78.update_chunk.
      super_unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>_>._M_t.
      super___uniq_ptr_impl<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::DataChunk_*,_std::default_delete<duckdb::DataChunk>_>.
      super__Head_base<0UL,_duckdb::DataChunk_*,_false>._M_head_impl !=
      (_Head_base<0UL,_duckdb::DataChunk_*,_false>)0x0) {
    DataChunk::~DataChunk
              ((DataChunk *)
               local_78.update_chunk.
               super_unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>_>._M_t.
               super___uniq_ptr_impl<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>_>.
               _M_t.
               super__Tuple_impl<0UL,_duckdb::DataChunk_*,_std::default_delete<duckdb::DataChunk>_>.
               super__Head_base<0UL,_duckdb::DataChunk_*,_false>._M_head_impl);
    operator_delete((void *)local_78.update_chunk.
                            super_unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>_>
                            ._M_t.
                            super___uniq_ptr_impl<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_duckdb::DataChunk_*,_std::default_delete<duckdb::DataChunk>_>
                            .super__Head_base<0UL,_duckdb::DataChunk_*,_false>._M_head_impl);
  }
  local_78.update_chunk.super_unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>_>
  ._M_t.super___uniq_ptr_impl<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::DataChunk_*,_std::default_delete<duckdb::DataChunk>_>.
  super__Head_base<0UL,_duckdb::DataChunk_*,_false>._M_head_impl =
       (unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>_>)
       (__uniq_ptr_data<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true,_true>)0x0;
  if (local_78.delete_chunk.
      super_unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>_>._M_t.
      super___uniq_ptr_impl<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::DataChunk_*,_std::default_delete<duckdb::DataChunk>_>.
      super__Head_base<0UL,_duckdb::DataChunk_*,_false>._M_head_impl !=
      (__uniq_ptr_data<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true,_true>)0x0) {
    DataChunk::~DataChunk
              ((DataChunk *)
               local_78.delete_chunk.
               super_unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>_>._M_t.
               super___uniq_ptr_impl<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>_>.
               _M_t.
               super__Tuple_impl<0UL,_duckdb::DataChunk_*,_std::default_delete<duckdb::DataChunk>_>.
               super__Head_base<0UL,_duckdb::DataChunk_*,_false>._M_head_impl);
    operator_delete((void *)local_78.delete_chunk.
                            super_unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>_>
                            ._M_t.
                            super___uniq_ptr_impl<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_duckdb::DataChunk_*,_std::default_delete<duckdb::DataChunk>_>
                            .super__Head_base<0UL,_duckdb::DataChunk_*,_false>._M_head_impl);
  }
  return;
}

Assistant:

void UndoBuffer::WriteToWAL(WriteAheadLog &wal, optional_ptr<StorageCommitState> commit_state) {
	WALWriteState state(transaction, wal, commit_state);
	UndoBuffer::IteratorState iterator_state;
	IterateEntries(iterator_state, [&](UndoFlags type, data_ptr_t data) { state.CommitEntry(type, data); });
}